

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * absl::HexStringToBytes_abi_cxx11_(string_view from)

{
  string *in_RDI;
  size_type num;
  string *result;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  Nullable<const_char_*> in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  s = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>(s,(size_t)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  (anonymous_namespace)::HexStringToBytesInternal<std::__cxx11::string&>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)s);
  return in_RDI;
}

Assistant:

std::string HexStringToBytes(absl::string_view from) {
  std::string result;
  const auto num = from.size() / 2;
  strings_internal::STLStringResizeUninitialized(&result, num);
  absl::HexStringToBytesInternal<std::string&>(from.data(), result, num);
  return result;
}